

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool bitset_container_is_subset_run(bitset_container_t *container1,run_container_t *container2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint64_t uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  
  iVar2 = container1->cardinality;
  if (iVar2 != -1) {
    lVar3 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar3 + 4) & 0x20) == 0) {
      iVar1 = container2->n_runs;
      lVar3 = (long)iVar1;
      if (0 < lVar3) {
        lVar6 = 0;
        do {
          iVar1 = iVar1 + (uint)container2->runs[lVar6].length;
          lVar6 = lVar6 + 1;
        } while (lVar3 != lVar6);
      }
    }
    else {
      iVar1 = _avx2_run_container_cardinality(container2);
    }
    if (iVar1 < iVar2) {
      return false;
    }
  }
  iVar2 = 0;
  uVar4 = 0;
  do {
    bVar11 = 0x3ff < (int)uVar4;
    if (0x3ff < (int)uVar4) {
      return bVar11;
    }
    if (container2->n_runs <= iVar2) {
      lVar3 = (long)(int)uVar4;
      do {
        bVar11 = container1->words[lVar3] == 0;
        if (!bVar11) {
          return bVar11;
        }
        bVar10 = lVar3 != 0x3ff;
        lVar3 = lVar3 + 1;
      } while (bVar10);
      return bVar11;
    }
    uVar7 = container1->words[(int)uVar4];
    if (uVar7 != 0) {
      do {
        if (container2->n_runs <= iVar2) {
          uVar8 = 1;
LAB_0010ed3e:
          bVar10 = uVar8 == 0;
          goto LAB_0010ed45;
        }
        lVar3 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        uVar5 = (uint)lVar3 | (uVar4 & 0x3ff) << 6;
        uVar8 = 1;
        uVar9 = (uint)container2->runs[iVar2].value;
        if (uVar9 <= uVar5) {
          if (container2->runs[iVar2].length + uVar9 < uVar5) {
            iVar2 = iVar2 + 1;
            uVar8 = 4;
          }
          else {
            uVar7 = uVar7 & uVar7 - 1;
            uVar8 = 0;
          }
        }
        if ((uVar8 & 3) != 0) goto LAB_0010ed3e;
      } while (uVar7 != 0);
    }
    uVar4 = uVar4 + 1;
    bVar10 = true;
LAB_0010ed45:
    if (!bVar10) {
      return bVar11;
    }
  } while( true );
}

Assistant:

bool bitset_container_is_subset_run(const bitset_container_t* container1,
                                    const run_container_t* container2) {
    // todo: this code could be much faster
    if (container1->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container1->cardinality > run_container_cardinality(container2)) {
            return false;
        }
    }
    int32_t i_bitset = 0, i_run = 0;
    while (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS &&
           i_run < container2->n_runs) {
        uint64_t w = container1->words[i_bitset];
        while (w != 0 && i_run < container2->n_runs) {
            uint32_t start = container2->runs[i_run].value;
            uint32_t stop = start + container2->runs[i_run].length;
            uint64_t t = w & (~w + 1);
            uint16_t r = i_bitset * 64 + __builtin_ctzll(w);
            if (r < start) {
                return false;
            } else if (r > stop) {
                i_run++;
                continue;
            } else {
                w ^= t;
            }
        }
        if (w == 0) {
            i_bitset++;
        } else {
            return false;
        }
    }
    if (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS) {
        // terminated iterating on the run containers, check that rest of bitset
        // is empty
        for (; i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS; i_bitset++) {
            if (container1->words[i_bitset] != 0) {
                return false;
            }
        }
    }
    return true;
}